

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsGetTypedArrayStorage
          (JsValueRef instance,BYTE **buffer,uint *bufferLength,JsTypedArrayType *typedArrayType,
          int *elementSize)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint32 uVar4;
  JsTypedArrayType JVar5;
  undefined4 *puVar6;
  RecyclableObject *this;
  TypedArrayBase *this_00;
  byte *pbVar7;
  TypedArrayBase *typedArrayBase;
  TypeId typeId;
  DebugCheckNoException __debugCheckNoException;
  int *elementSize_local;
  JsTypedArrayType *typedArrayType_local;
  uint *bufferLength_local;
  BYTE **buffer_local;
  JsValueRef instance_local;
  TypeId local_18;
  TypeId typeId_1;
  
  if (instance == (JsValueRef)0x0) {
    return JsErrorInvalidArgument;
  }
  if (buffer == (BYTE **)0x0) {
    return JsErrorNullArgument;
  }
  if (bufferLength == (uint *)0x0) {
    return JsErrorNullArgument;
  }
  __debugCheckNoException = (DebugCheckNoException)elementSize;
  DebugCheckNoException::DebugCheckNoException((DebugCheckNoException *)&stack0xffffffffffffffa8);
  if (instance == (JsValueRef)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                       ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = Js::TaggedInt::Is(instance);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = Js::JavascriptNumber::Is_NoTaggedIntCheck(instance);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      this = Js::UnsafeVarTo<Js::RecyclableObject>(instance);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_18 = Js::RecyclableObject::GetTypeId(this);
      if ((0x57 < (int)local_18) && (BVar3 = Js::RecyclableObject::IsExternal(this), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                           "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
  }
  BVar3 = Js::TypedArrayBase::Is(local_18);
  if (BVar3 == 0) {
    instance_local._4_4_ = JsErrorInvalidArgument;
    bVar2 = true;
  }
  else {
    this_00 = Js::VarTo<Js::TypedArrayBase>(instance);
    pbVar7 = Js::TypedArrayBase::GetByteBuffer(this_00);
    *buffer = pbVar7;
    uVar4 = Js::TypedArrayBase::GetByteLength(this_00);
    *bufferLength = uVar4;
    if (typedArrayType != (JsTypedArrayType *)0x0) {
      JVar5 = GetTypedArrayType(local_18);
      *typedArrayType = JVar5;
    }
    if (__debugCheckNoException != (DebugCheckNoException)0x0) {
      switch(local_18) {
      case TypeIds_Int8Array:
        *(undefined4 *)__debugCheckNoException = 1;
        break;
      case TypeIds_Uint8Array:
        *(undefined4 *)__debugCheckNoException = 1;
        break;
      case TypeIds_Uint8ClampedArray:
        *(undefined4 *)__debugCheckNoException = 1;
        break;
      case TypeIds_Int16Array:
        *(undefined4 *)__debugCheckNoException = 2;
        break;
      case TypeIds_Uint16Array:
        *(undefined4 *)__debugCheckNoException = 2;
        break;
      case TypeIds_Int32Array:
        *(undefined4 *)__debugCheckNoException = 4;
        break;
      case TypeIds_Uint32Array:
        *(undefined4 *)__debugCheckNoException = 4;
        break;
      case TypeIds_Float32Array:
        *(undefined4 *)__debugCheckNoException = 4;
        break;
      case TypeIds_Float64Array:
        *(undefined4 *)__debugCheckNoException = 8;
        break;
      default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                           ,0x92f,"(0)","invalid typed array type");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
        *(undefined4 *)__debugCheckNoException = 1;
        instance_local._4_4_ = JsErrorFatal;
        bVar2 = true;
        goto LAB_00403517;
      }
    }
    bVar2 = false;
  }
LAB_00403517:
  typeId._0_1_ = TypeIds_Undefined;
  DebugCheckNoException::~DebugCheckNoException((DebugCheckNoException *)&stack0xffffffffffffffa8);
  if (!bVar2) {
    instance_local._4_4_ = JsNoError;
  }
  return instance_local._4_4_;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsGetTypedArrayStorage(_In_ JsValueRef instance, _Outptr_result_bytebuffer_(*bufferLength) BYTE **buffer,
    _Out_ unsigned int *bufferLength, _Out_opt_ JsTypedArrayType *typedArrayType, _Out_opt_ int *elementSize)
{
    VALIDATE_JSREF(instance);
    PARAM_NOT_NULL(buffer);
    PARAM_NOT_NULL(bufferLength);

    BEGIN_JSRT_NO_EXCEPTION
    {
        const Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(instance);
        if (!Js::TypedArrayBase::Is(typeId))
        {
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }

        Js::TypedArrayBase* typedArrayBase = Js::VarTo<Js::TypedArrayBase>(instance);
        *buffer = typedArrayBase->GetByteBuffer();
        *bufferLength = typedArrayBase->GetByteLength();

        if (typedArrayType)
        {
            *typedArrayType = GetTypedArrayType(typeId);
        }

        if (elementSize)
        {
            switch (typeId)
            {
                case Js::TypeIds_Int8Array:
                    *elementSize = sizeof(int8);
                    break;
                case Js::TypeIds_Uint8Array:
                    *elementSize = sizeof(uint8);
                    break;
                case Js::TypeIds_Uint8ClampedArray:
                    *elementSize = sizeof(uint8);
                    break;
                case Js::TypeIds_Int16Array:
                    *elementSize = sizeof(int16);
                    break;
                case Js::TypeIds_Uint16Array:
                    *elementSize = sizeof(uint16);
                    break;
                case Js::TypeIds_Int32Array:
                    *elementSize = sizeof(int32);
                    break;
                case Js::TypeIds_Uint32Array:
                    *elementSize = sizeof(uint32);
                    break;
                case Js::TypeIds_Float32Array:
                    *elementSize = sizeof(float);
                    break;
                case Js::TypeIds_Float64Array:
                    *elementSize = sizeof(double);
                    break;
                default:
                    AssertMsg(FALSE, "invalid typed array type");
                    *elementSize = 1;
                    RETURN_NO_EXCEPTION(JsErrorFatal);
            }
        }
    }